

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O2

int __thiscall CVmPoolInMem::get_ofs(CVmPoolInMem *this,char *p,pool_ofs_t *ofs)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  size_t *psVar5;
  
  uVar1 = (this->super_CVmPoolPaged).page_slots_;
  iVar3 = -(int)p;
  psVar5 = &((this->super_CVmPoolPaged).pages_)->siz;
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
LAB_0025434c:
      return (uint)(uVar4 < uVar1);
    }
    pcVar2 = ((CVmPool_pg *)(psVar5 + -1))->mem;
    if ((pcVar2 <= p) && (p < pcVar2 + *psVar5)) {
      *ofs = -((int)pcVar2 + iVar3);
      goto LAB_0025434c;
    }
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 - *(int *)&(this->super_CVmPoolPaged).field_0x8;
    psVar5 = psVar5 + 2;
  } while( true );
}

Assistant:

inline int get_ofs(const char *p, pool_ofs_t *ofs)
    {
        /* check each page */
        pool_ofs_t page_ofs = 0;
        for (size_t i = 0 ; i < page_slots_ ; ++i, page_ofs += page_size_)
        {
            /* if it's in this page, it's a valid address */
            const char *mem = pages_[i].mem;
            if (p >= mem && p < mem + pages_[i].siz)
            {
                *ofs = (p - mem) + page_ofs;
                return TRUE;
            }
        }

        /* didn't find it */
        return FALSE;
    }